

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_galileo_rev_g.c
# Opt level: O3

mraa_result_t mraa_intel_galileo_g2_mmap_setup(mraa_gpio_context dev,mraa_boolean_t en)

{
  mraa_pin_t meta;
  mraa_boolean_t mVar1;
  mraa_result_t mVar2;
  long lVar3;
  mraa_pin_t *pmVar4;
  int *piVar5;
  char *pcVar6;
  undefined8 *puVar7;
  byte bVar8;
  undefined8 auStackY_e8 [7];
  undefined1 in_stack_ffffffffffffff50 [40];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 in_stack_ffffffffffffff7c [56];
  undefined4 local_18;
  
  bVar8 = 0;
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"Galileo mmap: context not valid");
    return MRAA_ERROR_INVALID_HANDLE;
  }
  mVar1 = mraa_pin_mode_test(dev->phy_pin,MRAA_PIN_FAST_GPIO);
  if (mVar1 == 0) {
    syslog(3,"Galileo mmap: mmap not on this pin");
    return MRAA_ERROR_NO_RESOURCES;
  }
  if (en == 0) {
    if (dev->mmap_write != (_func_mraa_result_t_mraa_gpio_context_int *)0x0) {
      dev->mmap_write = (_func_mraa_result_t_mraa_gpio_context_int *)0x0;
      mmap_count = mmap_count - 1;
      if (mmap_count != 0) {
        return MRAA_SUCCESS;
      }
      if (mmap_reg != (uint8_t *)0x0) {
        munmap(mmap_reg,0x1000);
        mmap_reg = (uint8_t *)0x0;
        close(mmap_fd);
        return MRAA_SUCCESS;
      }
      pcVar6 = "mmap: null register cant unsetup";
      goto LAB_00115dd9;
    }
    pcVar6 = "edison mmap: can\'t disable disabled mmap gpio";
  }
  else {
    if (dev->mmap_write == (_func_mraa_result_t_mraa_gpio_context_int *)0x0) {
      if (mmap_reg == (uint8_t *)0x0) {
        mmap_fd = open("/dev/uio0",2);
        if (mmap_fd < 0) {
          pcVar6 = "mmap: Unable to open UIO device";
          goto LAB_00115dd9;
        }
        mmap_reg = (uint8_t *)mmap((void *)0x0,0x1000,3,1,mmap_fd,0);
        if (mmap_reg == (uint8_t *)0xffffffffffffffff) {
          syslog(3,"mmap: failed to mmap");
          mmap_reg = (uint8_t *)0x0;
          close(mmap_fd);
          return MRAA_ERROR_NO_RESOURCES;
        }
      }
      pmVar4 = &plat->pins[dev->phy_pin].mmap.gpio;
      piVar5 = (int *)&stack0xffffffffffffff88;
      for (lVar3 = 0x19; lVar3 != 0; lVar3 = lVar3 + -1) {
        *piVar5 = pmVar4->pinmap;
        pmVar4 = (mraa_pin_t *)((long)pmVar4 + (ulong)bVar8 * -8 + 4);
        piVar5 = piVar5 + (ulong)bVar8 * -2 + 1;
      }
      piVar5 = (int *)&stack0xffffffffffffff88;
      puVar7 = auStackY_e8;
      for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar7 = *(undefined8 *)piVar5;
        piVar5 = piVar5 + ((ulong)bVar8 * -2 + 1) * 2;
        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
      }
      meta.mux[2].pin = local_18;
      auVar9 = in_stack_ffffffffffffff50._12_12_;
      auVar10 = in_stack_ffffffffffffff50._24_12_;
      meta.pinmap = in_stack_ffffffffffffff50._0_4_;
      meta.parent_id = in_stack_ffffffffffffff50._4_4_;
      meta.mux_total = in_stack_ffffffffffffff50._8_4_;
      meta.mux[0].pincmd = auVar9._0_4_;
      meta.mux[0].pin = auVar9._4_4_;
      meta.mux[0].value = auVar9._8_4_;
      meta.mux[1].pincmd = auVar10._0_4_;
      meta.mux[1].pin = auVar10._4_4_;
      meta.mux[1].value = auVar10._8_4_;
      meta.mux[2].pincmd = in_stack_ffffffffffffff50._36_4_;
      auVar9 = in_stack_ffffffffffffff7c._4_12_;
      auVar10 = in_stack_ffffffffffffff7c._16_12_;
      auVar11 = in_stack_ffffffffffffff7c._28_12_;
      meta.mux[2].value = in_stack_ffffffffffffff7c._0_4_;
      meta.mux[3].pincmd = auVar9._0_4_;
      meta.mux[3].pin = auVar9._4_4_;
      meta.mux[3].value = auVar9._8_4_;
      meta.mux[4].pincmd = auVar10._0_4_;
      meta.mux[4].pin = auVar10._4_4_;
      meta.mux[4].value = auVar10._8_4_;
      meta.mux[5].pincmd = auVar11._0_4_;
      meta.mux[5].pin = auVar11._4_4_;
      meta.mux[5].value = auVar11._8_4_;
      meta.output_enable = in_stack_ffffffffffffff7c._40_4_;
      meta.complex_cap = (mraa_pin_cap_complex_t)in_stack_ffffffffffffff7c._44_4_;
      meta.gpio_chip = in_stack_ffffffffffffff7c._48_4_;
      meta.gpio_line = in_stack_ffffffffffffff7c._52_4_;
      mVar2 = mraa_setup_mux_mapped(meta);
      if (mVar2 == MRAA_SUCCESS) {
        dev->mmap_write = mraa_intel_galileo_g2_mmap_write;
        return MRAA_SUCCESS;
      }
      pcVar6 = "mmap: unable to setup required multiplexers";
LAB_00115dd9:
      syslog(3,pcVar6);
      return MRAA_ERROR_INVALID_RESOURCE;
    }
    pcVar6 = "edison mmap: can\'t enable enabled mmap gpio";
  }
  syslog(3,pcVar6 + 7);
  return MRAA_ERROR_INVALID_PARAMETER;
}

Assistant:

mraa_result_t
mraa_intel_galileo_g2_mmap_setup(mraa_gpio_context dev, mraa_boolean_t en)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "Galileo mmap: context not valid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (mraa_pin_mode_test(dev->phy_pin, MRAA_PIN_FAST_GPIO) == 0) {
        syslog(LOG_ERR, "Galileo mmap: mmap not on this pin");
        return MRAA_ERROR_NO_RESOURCES;
    }
    if (en == 0) {
        if (dev->mmap_write == NULL) {
            syslog(LOG_ERR, "mmap: can't disable disabled mmap gpio");
            return MRAA_ERROR_INVALID_PARAMETER;
        }
        dev->mmap_write = NULL;
        mmap_count--;
        if (mmap_count == 0) {
            return mraa_intel_galileo_g2_mmap_unsetup();
        }
        return MRAA_SUCCESS;
    }

    if (dev->mmap_write != NULL) {
        syslog(LOG_ERR, "mmap: can't enable enabled mmap gpio");
        return MRAA_ERROR_INVALID_PARAMETER;
    }
    if (mmap_reg == NULL) {
        if ((mmap_fd = open(UIO_PATH, O_RDWR)) < 0) {
            syslog(LOG_ERR, "mmap: Unable to open UIO device");
            return MRAA_ERROR_INVALID_RESOURCE;
        }
        mmap_reg = mmap(NULL, mmap_size, PROT_READ | PROT_WRITE, MAP_SHARED, mmap_fd, 0);

        if (mmap_reg == MAP_FAILED) {
            syslog(LOG_ERR, "mmap: failed to mmap");
            mmap_reg = NULL;
            close(mmap_fd);
            return MRAA_ERROR_NO_RESOURCES;
        }
    }
    if (mraa_setup_mux_mapped(plat->pins[dev->phy_pin].mmap.gpio) != MRAA_SUCCESS) {
        syslog(LOG_ERR, "mmap: unable to setup required multiplexers");
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    dev->mmap_write = &mraa_intel_galileo_g2_mmap_write;
    return MRAA_SUCCESS;
}